

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O3

mz_uint32 mz_zip_writer_create_zip64_extra_data
                    (mz_uint8 *pBuf,mz_uint64 *pUncomp_size,mz_uint64 *pComp_size,
                    mz_uint64 *pLocal_header_ofs)

{
  mz_uint64 mVar1;
  mz_uint8 *pmVar2;
  mz_uint8 mVar3;
  mz_uint8 *pDst;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  
  pBuf[0] = '\x01';
  pBuf[1] = '\0';
  pBuf[2] = '\0';
  pBuf[3] = '\0';
  if (pUncomp_size == (mz_uint64 *)0x0) {
    pmVar2 = pBuf + 4;
    mVar3 = '\0';
  }
  else {
    mVar1 = *pUncomp_size;
    auVar5 = vpbroadcastq_avx512vl();
    auVar5 = vpsrlvq_avx2(auVar5,_DAT_0015e500);
    pBuf[4] = (mz_uint8)mVar1;
    auVar4 = vpmovqb_avx512vl(auVar5);
    *(int *)(pBuf + 5) = auVar4._0_4_;
    pBuf[9] = (mz_uint8)(mVar1 >> 0x28);
    pBuf[10] = (mz_uint8)(mVar1 >> 0x30);
    pBuf[0xb] = (mz_uint8)(mVar1 >> 0x38);
    pmVar2 = pBuf + 0xc;
    mVar3 = '\b';
  }
  if (pComp_size != (mz_uint64 *)0x0) {
    mVar1 = *pComp_size;
    mVar3 = mVar3 + '\b';
    auVar5 = vpbroadcastq_avx512vl();
    auVar5 = vpsrlvq_avx2(auVar5,_DAT_0015e500);
    *pmVar2 = (mz_uint8)mVar1;
    auVar4 = vpmovqb_avx512vl(auVar5);
    *(int *)(pmVar2 + 1) = auVar4._0_4_;
    pmVar2[5] = (mz_uint8)(mVar1 >> 0x28);
    pmVar2[6] = (mz_uint8)(mVar1 >> 0x30);
    pmVar2[7] = (mz_uint8)(mVar1 >> 0x38);
    pmVar2 = pmVar2 + 8;
  }
  if (pLocal_header_ofs != (mz_uint64 *)0x0) {
    mVar1 = *pLocal_header_ofs;
    mVar3 = mVar3 + '\b';
    auVar5 = vpbroadcastq_avx512vl();
    auVar5 = vpsrlvq_avx2(auVar5,_DAT_0015e500);
    *pmVar2 = (mz_uint8)mVar1;
    auVar4 = vpmovqb_avx512vl(auVar5);
    *(int *)(pmVar2 + 1) = auVar4._0_4_;
    pmVar2[5] = (mz_uint8)(mVar1 >> 0x28);
    pmVar2[6] = (mz_uint8)(mVar1 >> 0x30);
    pmVar2[7] = (mz_uint8)(mVar1 >> 0x38);
    pmVar2 = pmVar2 + 8;
  }
  pBuf[2] = mVar3;
  pBuf[3] = '\0';
  return (int)pmVar2 - (int)pBuf;
}

Assistant:

static MZ_FORCEINLINE void mz_write_le16(mz_uint8* p, mz_uint16 v) {

    p[0] = (mz_uint8)v;
    p[1] = (mz_uint8)(v >> 8);
}